

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

RealType __thiscall
OpenMD::SelectionEvaluator::getCharge(SelectionEvaluator *this,Atom *atom,int frame)

{
  AtomType *pAVar1;
  SnapshotManager *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  RealType RVar5;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter local_28;
  FluctuatingChargeAdapter local_20;
  
  pAVar1 = atom->atomType_;
  local_28.at_ = pAVar1;
  bVar3 = FixedChargeAdapter::isFixedCharge(&local_28);
  RVar5 = 0.0;
  if (bVar3) {
    RVar5 = FixedChargeAdapter::getCharge(&local_28);
  }
  local_20.at_ = pAVar1;
  bVar3 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_20);
  if (bVar3) {
    pSVar2 = (atom->super_StuntDouble).snapshotMan_;
    iVar4 = (*pSVar2->_vptr_SnapshotManager[4])(pSVar2,(ulong)(uint)frame);
    RVar5 = RVar5 + *(double *)
                     (*(long *)(CONCAT44(extraout_var,iVar4) + 0x150 +
                               (atom->super_StuntDouble).storage_) +
                     (long)(atom->super_StuntDouble).localIndex_ * 8);
  }
  return RVar5;
}

Assistant:

RealType SelectionEvaluator::getCharge(Atom* atom, int frame) {
    RealType charge    = 0.0;
    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(frame); }
    return charge;
  }